

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnImportGlobal
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index global_index,Type type,bool mutable_)

{
  Module *this_00;
  byte bVar1;
  pointer pGVar2;
  Location local_c0;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_a0;
  string local_98;
  string local_68;
  unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> local_48;
  unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> import;
  bool mutable__local;
  Index import_index_local;
  BinaryReaderIR *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local.data_ = (char *)field_name.size_;
  this_local = (BinaryReaderIR *)field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  import._M_t.super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
  super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._3_1_ = mutable_;
  import._M_t.super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
  super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._4_4_ = import_index;
  MakeUnique<wabt::GlobalImport>();
  string_view::to_string_abi_cxx11_(&local_68,(string_view *)&field_name_local.size_);
  pGVar2 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::operator->
                     (&local_48);
  std::__cxx11::string::operator=
            ((string *)&(pGVar2->super_ImportMixin<(wabt::ExternalKind)3>).super_Import.module_name,
             (string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  string_view::to_string_abi_cxx11_(&local_98,(string_view *)&this_local);
  pGVar2 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::operator->
                     (&local_48);
  std::__cxx11::string::operator=
            ((string *)&(pGVar2->super_ImportMixin<(wabt::ExternalKind)3>).super_Import.field_name,
             (string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  pGVar2 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::operator->
                     (&local_48);
  bVar1 = import._M_t.
          super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
          super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._3_1_;
  (pGVar2->global).type = type;
  pGVar2 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::operator->
                     (&local_48);
  (pGVar2->global).mutable_ = (bool)(bVar1 & 1);
  this_00 = this->module_;
  GetLocation(&local_c0,this);
  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>>,wabt::Location>
            ((wabt *)&local_a0,&local_48,&local_c0);
  Module::AppendField(this_00,&local_a0);
  std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
  ~unique_ptr(&local_a0);
  Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
  std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::~unique_ptr
            (&local_48);
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderIR::OnImportGlobal(Index import_index,
                                      string_view module_name,
                                      string_view field_name,
                                      Index global_index,
                                      Type type,
                                      bool mutable_) {
  auto import = MakeUnique<GlobalImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->global.type = type;
  import->global.mutable_ = mutable_;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}